

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall cmLBDepend::DependWalk(cmLBDepend *this,cmDependInformation *info)

{
  pointer pbVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  pointer pbVar6;
  char cVar7;
  string cxxFile;
  string line;
  string includeFile;
  string root;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream fin;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fin,(info->FullPath)._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1);
      if (!bVar2) break;
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,9ul>(&line,(char (*) [9])"#include");
      if (bVar2) {
        cVar7 = (char)&line;
        lVar5 = std::__cxx11::string::find(cVar7,0x22);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find(cVar7,0x3c);
          if (lVar5 != -1) {
            bVar3 = 0x3e;
            goto LAB_0027c4b5;
          }
          std::operator+(&includeFile,"unknown include directive ",&line);
          cmSystemTools::Error(&includeFile);
        }
        else {
          bVar3 = 0x22;
LAB_0027c4b5:
          std::__cxx11::string::find((char)&line,(ulong)bVar3);
          std::__cxx11::string::substr((ulong)&includeFile,(ulong)&line);
          bVar2 = cmsys::RegularExpression::find
                            (&this->IncludeFileRegularExpression,includeFile._M_dataplus._M_p);
          if (bVar2) {
            AddDependency(this,info,includeFile._M_dataplus._M_p);
            std::__cxx11::string::string((string *)&cxxFile,(string *)&includeFile);
            lVar5 = std::__cxx11::string::rfind((char)&cxxFile,0x2e);
            if (lVar5 != -1) {
              std::__cxx11::string::substr((ulong)&root,(ulong)&cxxFile);
              std::operator+(&path,&root,".cxx");
              std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
              std::__cxx11::string::~string((string *)&path);
              bVar2 = cmsys::SystemTools::FileExists(&cxxFile);
              pbVar1 = (this->IncludeDirectories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar6 = (this->IncludeDirectories).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
                  pbVar6 = pbVar6 + 1) {
                std::__cxx11::string::string((string *)&path,(string *)pbVar6);
                std::operator+(&local_258,&path,"/");
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::operator+(&local_258,&path,&cxxFile);
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                bVar4 = cmsys::SystemTools::FileExists(&path);
                if (bVar4) {
                  bVar2 = true;
                }
                std::__cxx11::string::~string((string *)&path);
              }
              if (bVar2 == false) {
                std::operator+(&path,&root,".cpp");
                std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
                std::__cxx11::string::~string((string *)&path);
                bVar4 = cmsys::SystemTools::FileExists(&cxxFile);
                if (bVar4) {
                  bVar2 = true;
                }
                pbVar1 = (this->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar6 = (this->IncludeDirectories).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
                    pbVar6 = pbVar6 + 1) {
                  std::__cxx11::string::string((string *)&path,(string *)pbVar6);
                  std::operator+(&local_258,&path,"/");
                  std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  std::operator+(&local_258,&path,&cxxFile);
                  std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  bVar4 = cmsys::SystemTools::FileExists(&path);
                  if (bVar4) {
                    bVar2 = true;
                  }
                  std::__cxx11::string::~string((string *)&path);
                }
              }
              if (bVar2 == false) {
                std::operator+(&path,&root,".c");
                std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
                std::__cxx11::string::~string((string *)&path);
                bVar4 = cmsys::SystemTools::FileExists(&cxxFile);
                if (bVar4) {
                  bVar2 = true;
                }
                pbVar1 = (this->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar6 = (this->IncludeDirectories).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
                    pbVar6 = pbVar6 + 1) {
                  std::__cxx11::string::string((string *)&path,(string *)pbVar6);
                  std::operator+(&local_258,&path,"/");
                  std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  std::operator+(&local_258,&path,&cxxFile);
                  std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  bVar4 = cmsys::SystemTools::FileExists(&path);
                  if (bVar4) {
                    bVar2 = true;
                  }
                  std::__cxx11::string::~string((string *)&path);
                }
              }
              if (bVar2 == false) {
                std::operator+(&path,&root,".txx");
                std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
                std::__cxx11::string::~string((string *)&path);
                bVar4 = cmsys::SystemTools::FileExists(&cxxFile);
                if (bVar4) {
                  bVar2 = true;
                }
                pbVar1 = (this->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar6 = (this->IncludeDirectories).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
                    pbVar6 = pbVar6 + 1) {
                  std::__cxx11::string::string((string *)&path,(string *)pbVar6);
                  std::operator+(&local_258,&path,"/");
                  std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  std::operator+(&local_258,&path,&cxxFile);
                  std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  bVar4 = cmsys::SystemTools::FileExists(&path);
                  if (bVar4) {
                    bVar2 = true;
                  }
                  std::__cxx11::string::~string((string *)&path);
                }
              }
              if (bVar2 != false) {
                AddDependency(this,info,cxxFile._M_dataplus._M_p);
              }
              std::__cxx11::string::~string((string *)&root);
            }
          }
          else {
            if (this->Verbose != true) goto LAB_0027c6e8;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cxxFile,"Skipping ",(allocator<char> *)&root);
            std::__cxx11::string::append((string *)&cxxFile);
            std::__cxx11::string::append((char *)&cxxFile);
            std::__cxx11::string::append((string *)&cxxFile);
            cmSystemTools::Error(&cxxFile);
          }
          std::__cxx11::string::~string((string *)&cxxFile);
        }
LAB_0027c6e8:
        std::__cxx11::string::~string((string *)&includeFile);
      }
    }
  }
  else {
    std::operator+(&line,"error can not open ",&info->FullPath);
    cmSystemTools::Error(&line);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&fin);
  return;
}

Assistant:

void DependWalk(cmDependInformation* info)
  {
    cmsys::ifstream fin(info->FullPath.c_str());
    if (!fin) {
      cmSystemTools::Error("error can not open " + info->FullPath);
      return;
    }

    std::string line;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      if (cmHasLiteralPrefix(line, "#include")) {
        // if it is an include line then create a string class
        size_t qstart = line.find('\"', 8);
        size_t qend;
        // if a quote is not found look for a <
        if (qstart == std::string::npos) {
          qstart = line.find('<', 8);
          // if a < is not found then move on
          if (qstart == std::string::npos) {
            cmSystemTools::Error("unknown include directive " + line);
            continue;
          }
          qend = line.find('>', qstart + 1);
        } else {
          qend = line.find('\"', qstart + 1);
        }
        // extract the file being included
        std::string includeFile = line.substr(qstart + 1, qend - qstart - 1);
        // see if the include matches the regular expression
        if (!this->IncludeFileRegularExpression.find(includeFile)) {
          if (this->Verbose) {
            std::string message = "Skipping ";
            message += includeFile;
            message += " for file ";
            message += info->FullPath;
            cmSystemTools::Error(message);
          }
          continue;
        }

        // Add this file and all its dependencies.
        this->AddDependency(info, includeFile.c_str());
        /// add the cxx file if it exists
        std::string cxxFile = includeFile;
        std::string::size_type pos = cxxFile.rfind('.');
        if (pos != std::string::npos) {
          std::string root = cxxFile.substr(0, pos);
          cxxFile = root + ".cxx";
          bool found = false;
          // try jumping to .cxx .cpp and .c in order
          if (cmSystemTools::FileExists(cxxFile)) {
            found = true;
          }
          for (std::string path : this->IncludeDirectories) {
            path = path + "/";
            path = path + cxxFile;
            if (cmSystemTools::FileExists(path)) {
              found = true;
            }
          }
          if (!found) {
            cxxFile = root + ".cpp";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (!found) {
            cxxFile = root + ".c";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (!found) {
            cxxFile = root + ".txx";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (found) {
            this->AddDependency(info, cxxFile.c_str());
          }
        }
      }
    }
  }